

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_DefinePropertyDesc(JSContext *ctx,JSValue obj,JSAtom prop,JSValue desc,int flags)

{
  JSValue getter;
  JSValue setter;
  int iVar1;
  JSPropertyDescriptor d;
  JSPropertyDescriptor local_60;
  
  iVar1 = js_obj_to_desc(ctx,&local_60,desc);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    getter.tag = local_60.getter.tag;
    getter.u.float64 = local_60.getter.u.float64;
    setter.tag = local_60.setter.tag;
    setter.u.float64 = local_60.setter.u.float64;
    iVar1 = JS_DefineProperty(ctx,obj,prop,local_60.value,getter,setter,flags | local_60.flags);
    js_free_desc(ctx,&local_60);
  }
  return iVar1;
}

Assistant:

static __exception int JS_DefinePropertyDesc(JSContext *ctx, JSValueConst obj,
                                             JSAtom prop, JSValueConst desc,
                                             int flags)
{
    JSPropertyDescriptor d;
    int ret;

    if (js_obj_to_desc(ctx, &d, desc) < 0)
        return -1;

    ret = JS_DefineProperty(ctx, obj, prop,
                            d.value, d.getter, d.setter, d.flags | flags);
    js_free_desc(ctx, &d);
    return ret;
}